

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O2

int mbedtls_x509_get_time(uchar **p,uchar *end,mbedtls_x509_time *time)

{
  uchar *puVar1;
  int iVar2;
  int iVar3;
  size_t len;
  
  puVar1 = *p;
  if (end == puVar1 || (long)end - (long)puVar1 < 0) {
    return -0x2460;
  }
  if (*puVar1 == '\x18') {
    *p = puVar1 + 1;
    iVar2 = mbedtls_asn1_get_len(p,end,&len);
    if (iVar2 != 0) goto LAB_00168a6b;
    iVar2 = x509_parse_int(p,4,&time->year);
    if (iVar2 != 0) {
      return iVar2;
    }
    iVar2 = x509_parse_int(p,2,&time->mon);
    if (iVar2 != 0) {
      return iVar2;
    }
    iVar2 = x509_parse_int(p,2,&time->day);
    if (iVar2 != 0) {
      return iVar2;
    }
    iVar2 = x509_parse_int(p,2,&time->hour);
    if (iVar2 != 0) {
      return iVar2;
    }
    iVar2 = x509_parse_int(p,2,&time->min);
    if (iVar2 != 0) {
      return iVar2;
    }
    if (0xc < len) {
      iVar2 = x509_parse_int(p,2,&time->sec);
      if (iVar2 != 0) {
        return iVar2;
      }
      if ((0xe < len) && (puVar1 = *p, *p = puVar1 + 1, *puVar1 != 'Z')) {
        return -0x2400;
      }
    }
  }
  else {
    if (*puVar1 != '\x17') {
      return -0x2462;
    }
    *p = puVar1 + 1;
    iVar2 = mbedtls_asn1_get_len(p,end,&len);
    if (iVar2 != 0) {
LAB_00168a6b:
      return iVar2 + -0x2400;
    }
    iVar2 = x509_parse_int(p,2,&time->year);
    if (iVar2 != 0) {
      return iVar2;
    }
    iVar2 = x509_parse_int(p,2,&time->mon);
    if (iVar2 != 0) {
      return iVar2;
    }
    iVar2 = x509_parse_int(p,2,&time->day);
    if (iVar2 != 0) {
      return iVar2;
    }
    iVar2 = x509_parse_int(p,2,&time->hour);
    if (iVar2 != 0) {
      return iVar2;
    }
    iVar2 = x509_parse_int(p,2,&time->min);
    if (iVar2 != 0) {
      return iVar2;
    }
    if (10 < len) {
      iVar2 = x509_parse_int(p,2,&time->sec);
      if (iVar2 != 0) {
        return iVar2;
      }
      if ((0xc < len) && (puVar1 = *p, *p = puVar1 + 1, *puVar1 != 'Z')) {
        return -0x2400;
      }
    }
    iVar2 = time->year;
    iVar3 = iVar2 + 100;
    if (0x31 < iVar2) {
      iVar3 = iVar2;
    }
    time->year = iVar3 + 0x76c;
  }
  return 0;
}

Assistant:

int mbedtls_x509_get_time( unsigned char **p, const unsigned char *end,
                   mbedtls_x509_time *time )
{
    int ret;
    size_t len;
    unsigned char tag;

    if( ( end - *p ) < 1 )
        return( MBEDTLS_ERR_X509_INVALID_DATE +
                MBEDTLS_ERR_ASN1_OUT_OF_DATA );

    tag = **p;

    if( tag == MBEDTLS_ASN1_UTC_TIME )
    {
        (*p)++;
        ret = mbedtls_asn1_get_len( p, end, &len );

        if( ret != 0 )
            return( MBEDTLS_ERR_X509_INVALID_DATE + ret );

        CHECK( x509_parse_int( p, 2, &time->year ) );
        CHECK( x509_parse_int( p, 2, &time->mon ) );
        CHECK( x509_parse_int( p, 2, &time->day ) );
        CHECK( x509_parse_int( p, 2, &time->hour ) );
        CHECK( x509_parse_int( p, 2, &time->min ) );
        if( len > 10 )
            CHECK( x509_parse_int( p, 2, &time->sec ) );
        if( len > 12 && *(*p)++ != 'Z' )
            return( MBEDTLS_ERR_X509_INVALID_DATE );

        time->year +=  100 * ( time->year < 50 );
        time->year += 1900;

        return( 0 );
    }
    else if( tag == MBEDTLS_ASN1_GENERALIZED_TIME )
    {
        (*p)++;
        ret = mbedtls_asn1_get_len( p, end, &len );

        if( ret != 0 )
            return( MBEDTLS_ERR_X509_INVALID_DATE + ret );

        CHECK( x509_parse_int( p, 4, &time->year ) );
        CHECK( x509_parse_int( p, 2, &time->mon ) );
        CHECK( x509_parse_int( p, 2, &time->day ) );
        CHECK( x509_parse_int( p, 2, &time->hour ) );
        CHECK( x509_parse_int( p, 2, &time->min ) );
        if( len > 12 )
            CHECK( x509_parse_int( p, 2, &time->sec ) );
        if( len > 14 && *(*p)++ != 'Z' )
            return( MBEDTLS_ERR_X509_INVALID_DATE );

        return( 0 );
    }
    else
        return( MBEDTLS_ERR_X509_INVALID_DATE +
                MBEDTLS_ERR_ASN1_UNEXPECTED_TAG );
}